

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O3

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::ListTypeInfo::Deserialize(ListTypeInfo *this,Deserializer *deserializer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ListTypeInfo *pLVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar4;
  shared_ptr<duckdb::ListTypeInfo,_true> local_48;
  LogicalType local_30;
  
  pLVar3 = (ListTypeInfo *)operator_new(0x50);
  ListTypeInfo(pLVar3);
  local_48.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pLVar3;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::ListTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_48.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,pLVar3);
  pLVar3 = shared_ptr<duckdb::ListTypeInfo,_true>::operator->(&local_48);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"child_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&local_30,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (pLVar3->child_type).id_ = local_30.id_;
  (pLVar3->child_type).physical_type_ = local_30.physical_type_;
  peVar1 = (pLVar3->child_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (pLVar3->child_type).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pLVar3->child_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (pLVar3->child_type).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_30.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_30.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  local_30.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var2;
  LogicalType::~LogicalType(&local_30);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_48.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_48.internal.super___shared_ptr<duckdb::ListTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar4.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> ListTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<ListTypeInfo>(new ListTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "child_type", result->child_type);
	return std::move(result);
}